

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O2

void pg::set_in_CALL(WorkerP *w,Task *__dq_head,int arg_1,int arg_2)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  Worker *pWVar3;
  int arg_2_00;
  long lVar4;
  long lVar5;
  TD_set_in *t;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar7 = (ulong)(uint)arg_2;
  while( true ) {
    uVar6 = (uint)uVar7;
    if ((int)uVar6 < 0x41) {
      lVar4 = (long)arg_1;
      uVar7 = (ulong)(~((int)uVar6 >> 0x1f) & uVar6);
      while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
        if (((*(int *)(done + lVar4 * 4) != 3) &&
            (lVar5 = (long)*(int *)(str + lVar4 * 4), lVar5 != -1)) &&
           (*(int *)(halt + lVar5 * 4) == 0)) {
          LOCK();
          puVar1 = (undefined4 *)(first_in + lVar5 * 4);
          uVar2 = *puVar1;
          *puVar1 = (int)lVar4;
          UNLOCK();
          *(undefined4 *)(next_in + lVar4 * 4) = uVar2;
        }
        lVar4 = lVar4 + 1;
      }
      return;
    }
    if (w->end == __dq_head) break;
    __dq_head->f = set_in_WRAP;
    (__dq_head->thief)._M_b._M_p = (__pointer_type)0x1;
    arg_2_00 = (int)(uVar7 >> 1);
    *(int *)__dq_head->d = arg_2_00 + arg_1;
    *(uint *)(__dq_head->d + 4) = uVar6 - arg_2_00;
    pWVar3 = w->_public;
    if (w->allstolen == '\0') {
      if (pWVar3->movesplit != '\0') {
        uVar6 = (uint)((int)((ulong)((long)__dq_head - (long)w->dq) >> 6) + 2 +
                      (int)((ulong)((long)w->split - (long)w->dq) >> 6)) >> 1;
        LOCK();
        *(uint *)((long)&pWVar3->ts + 4) = uVar6;
        UNLOCK();
        w->split = w->dq + uVar6;
        pWVar3->movesplit = '\0';
      }
    }
    else {
      if (pWVar3->movesplit != '\0') {
        pWVar3->movesplit = '\0';
      }
      uVar7 = (long)__dq_head - (long)w->dq;
      LOCK();
      pWVar3->ts = (TailSplit)
                   ((uVar7 >> 6 & 0xffffffff | (uVar7 & 0xffffffffffffffc0) << 0x1a) + 0x100000000);
      UNLOCK();
      pWVar3->allstolen = '\0';
      w->split = __dq_head + 1;
      w->allstolen = '\0';
    }
    set_in_CALL(w,__dq_head + 1,arg_1,arg_2_00);
    if ((w->_public->movesplit != '\0') || (__dq_head < w->split)) {
      set_in_SYNC_SLOW(w,__dq_head);
      return;
    }
    (__dq_head->thief)._M_b._M_p = (__pointer_type)0x0;
    arg_1 = *(int *)__dq_head->d;
    uVar7 = (ulong)*(uint *)(__dq_head->d + 4);
  }
  lace_abort_stack_overflow();
}

Assistant:

VOID_TASK_2(set_in, int, begin, int, count)
{
    // some cut-off point...
    if (count <= 64) {
        for (int i=0; i<count; i++) {
            int n = begin+i;
            if (done[n] != 3) {
                int s = str[n];
                if (s != -1 and !halt[s]) {
                    // atomically set first_in[s] to n, and return the previous value
                    next_in[n] = __sync_lock_test_and_set(first_in+s, n);
                }
            }
        }
    } else {
        SPAWN(set_in, begin+count/2, count-count/2);
        CALL(set_in, begin, count/2);
        SYNC(set_in);
    }
}